

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_make_transformation_rotationv3_EXP(matrix4 *self,vector3 *vR)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  anon_union_128_5_d0a4420b_for_matrix4_0 local_90;
  
  (self->field_0).m[0] = 1.0;
  (self->field_0).m[1] = 0.0;
  (self->field_0).m[2] = 0.0;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[4] = 0.0;
  (self->field_0).m[5] = 1.0;
  (self->field_0).m[6] = 0.0;
  (self->field_0).m[7] = 0.0;
  (self->field_0).m[8] = 0.0;
  (self->field_0).m[9] = 0.0;
  (self->field_0).m[10] = 1.0;
  (self->field_0).m[0xb] = 0.0;
  (self->field_0).m[0xc] = 0.0;
  (self->field_0).m[0xd] = 0.0;
  (self->field_0).m[0xe] = 0.0;
  (self->field_0).m[0xf] = 1.0;
  dVar1 = (vR->field_0).v[0];
  dVar2 = (vR->field_0).v[1];
  dVar3 = (vR->field_0).v[2];
  dVar4 = cos(dVar1);
  dVar1 = sin(dVar1);
  dVar5 = cos(dVar2);
  dVar2 = sin(dVar2);
  dVar6 = cos(dVar3);
  dVar3 = sin(dVar3);
  local_90.m[0] = dVar5 * dVar6;
  local_90.m[4] = -dVar5 * dVar3;
  local_90.m[1] = dVar1 * dVar2 * dVar6 + dVar4 * dVar3;
  local_90.m[2] = -(dVar4 * dVar2) * dVar6 + dVar1 * dVar3;
  local_90.m[5] = -(dVar1 * dVar2) * dVar3 + dVar6 * dVar4;
  local_90.m[6] = dVar4 * dVar2 * dVar3 + dVar6 * dVar1;
  local_90._80_4_ = SUB84(dVar4 * dVar5,0);
  local_90._72_8_ = -dVar1 * dVar5;
  local_90._84_4_ = (int)((ulong)(dVar4 * dVar5) >> 0x20);
  local_90.m[0xd] = 0.0;
  local_90.m[0xe] = 0.0;
  local_90.m[3] = 0.0;
  local_90.m[7] = 0.0;
  local_90.m[0xb] = 0.0;
  local_90.m[0xc] = 0.0;
  local_90.m[0xf] = 1.0;
  local_90.m[8] = dVar2;
  matrix4_multiply(self,(matrix4 *)&local_90.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_make_transformation_rotationv3_EXP(struct matrix4 *self, const struct vector3 *vR)
{
	struct matrix4 scratchMatrix;

	matrix4_identity(self);

	return matrix4_multiply(self,
		matrix4_set_from_euler_anglesf3_EXP(&scratchMatrix, vR->x, vR->y, vR->z));
}